

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O3

void wasm::ReReloop::BlockTask::handle(ReReloop *parent,Block *curr)

{
  Expression **ppEVar1;
  Expression *pEVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Block *pBVar4;
  mapped_type *ppBVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  key_type local_40;
  
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01075890;
    *(ReReloop **)&this[1]._M_use_count = parent;
    this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Task_010758c8;
    this[2]._vptr__Sp_counted_base = (_func_int **)curr;
    pBVar4 = makeCFGBlock(parent);
    *(Block **)&this[2]._M_use_count = pBVar4;
    local_40.super_IString.str._M_len = (curr->name).super_IString.str._M_len;
    local_40.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
    ppBVar5 = std::
              map<wasm::Name,_CFG::Block_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_CFG::Block_*>_>_>
              ::operator[](&parent->breakTargets,&local_40);
    local_40.super_IString.str._M_len = (size_t)(this + 1);
    *ppBVar5 = pBVar4;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    local_40.super_IString.str._M_str = (char *)this;
    std::
    vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
    ::emplace_back<std::shared_ptr<wasm::ReReloop::Task>>
              ((vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
                *)&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)&local_40);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  uVar6 = (uint)(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)(uVar6 & 0x7fffffff);
    do {
      uVar7 = uVar8 - 1;
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar7) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = (curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      local_40.super_IString.str._M_str = (char *)operator_new(0x28);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str)->
      _M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str)->
      _M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_010758f0;
      local_40.super_IString.str._M_len = (long)local_40.super_IString.str._M_str + 0x10;
      pEVar2 = ppEVar1[uVar7];
      *(ReReloop **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        ((long)local_40.super_IString.str._M_str + 0x10))->_M_use_count = parent;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      ((long)local_40.super_IString.str._M_str + 0x10))->_vptr__Sp_counted_base =
           (_func_int **)&PTR__Task_01075868;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      ((long)local_40.super_IString.str._M_str + 0x20))->_vptr__Sp_counted_base =
           (_func_int **)pEVar2;
      std::
      vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
      ::emplace_back<std::shared_ptr<wasm::ReReloop::Task>>
                ((vector<std::shared_ptr<wasm::ReReloop::Task>,std::allocator<std::shared_ptr<wasm::ReReloop::Task>>>
                  *)&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)&local_40);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_IString.str._M_str
                  );
      }
      bVar3 = 1 < uVar8;
      uVar8 = uVar7;
    } while (bVar3);
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Block* curr) {
      if (curr->name.is()) {
        // we may be branched to. create a target, and
        // ensure we are called at the join point
        auto task = std::make_shared<BlockTask>(parent, curr);
        task->curr = curr;
        task->later = parent.makeCFGBlock();
        parent.addBreakTarget(curr->name, task->later);
        parent.stack.push_back(task);
      }
      auto& list = curr->list;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        parent.stack.push_back(std::make_shared<TriageTask>(parent, list[i]));
      }
    }